

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

bool __thiscall TTD::MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)3>(MarkTable *this,void *vaddr)

{
  uint64 uVar1;
  int32 iVar2;
  
  iVar2 = FindIndexForKeyWGrow(this,vaddr);
  uVar1 = this->m_addrArray[iVar2];
  if (uVar1 == 0) {
    this->m_addrArray[iVar2] = (uint64)vaddr;
    this->m_markArray[iVar2] = PrimitiveObjectTag;
    this->m_count = this->m_count + 1;
    this->m_handlerCounts[3] = this->m_handlerCounts[3] + 1;
  }
  if (this->m_markArray[iVar2] == PrimitiveObjectTag) {
    return uVar1 == 0;
  }
  TTDAbort_unrecoverable_error("We had some sort of collision.");
}

Assistant:

bool MarkAndTestAddr(const void* vaddr)
        {
            int32 idx = this->FindIndexForKeyWGrow(vaddr);

            //we really want to do the check on m_markArray but since we know nothing has been cleared we can check the addrArray for better cache behavior
            bool notMarked = this->m_addrArray[idx] == 0;

            if (notMarked)
            {
                this->m_addrArray[idx] = reinterpret_cast<uint64>(vaddr);
                this->m_markArray[idx] = kindtag;

                this->m_count++;
                (this->m_handlerCounts[(uint32)kindtag])++;
            }
            TTDAssert(this->m_markArray[idx] == kindtag, "We had some sort of collision.");

            return notMarked;
        }